

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getCols(Highs *this,HighsInt num_set_entries,HighsInt *set,HighsInt *num_col,double *costs,
              double *lower,double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,
              double *value)

{
  HighsInt HVar1;
  undefined4 *in_RCX;
  int in_ESI;
  undefined4 *in_stack_00000010;
  HighsLogOptions *in_stack_00000018;
  HighsInt create_error;
  HighsIndexCollection index_collection;
  HighsLogOptions *in_stack_fffffffffffffe88;
  HighsLogOptions *in_stack_fffffffffffffe90;
  HighsInt *in_stack_fffffffffffffea0;
  HighsInt in_stack_fffffffffffffeac;
  allocator *paVar2;
  string *method;
  undefined4 in_stack_fffffffffffffec0;
  HighsInt in_stack_fffffffffffffed0;
  HighsInt in_stack_fffffffffffffed4;
  HighsInt *in_stack_fffffffffffffed8;
  HighsInt in_stack_fffffffffffffee4;
  HighsIndexCollection *in_stack_fffffffffffffee8;
  double *in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  double *in_stack_ffffffffffffff20;
  HighsInt *in_stack_ffffffffffffff28;
  HighsIndexCollection *in_stack_ffffffffffffff30;
  Highs *in_stack_ffffffffffffff38;
  HighsInt *in_stack_ffffffffffffff70;
  HighsInt *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  HighsStatus local_c;
  
  if (in_ESI == 0) {
    *in_RCX = 0;
    *in_stack_00000010 = 0;
    local_c = kOk;
  }
  else {
    method = (string *)&stack0xffffffffffffff70;
    HighsIndexCollection::HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffe90);
    HVar1 = create(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffed4);
    if (HVar1 == 0) {
      getColsInterface(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
                       ,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       in_stack_ffffffffffffff10,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78
                       ,(HighsInt *)in_stack_ffffffffffffff80,(double *)in_stack_ffffffffffffff88);
      local_c = kOk;
      in_stack_fffffffffffffe90 = in_stack_00000018;
    }
    else {
      HighsLogOptions::HighsLogOptions(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      paVar2 = (allocator *)&stack0xfffffffffffffed7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffed8,"getCols",paVar2);
      local_c = analyseSetCreateError
                          ((HighsLogOptions *)CONCAT44(HVar1,in_stack_fffffffffffffec0),method,
                           (HighsInt)((ulong)paVar2 >> 0x20),SUB81((ulong)paVar2 >> 0x18,0),
                           in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,
                           in_stack_fffffffffffffed0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x49608d);
    }
    HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffe90);
  }
  return local_c;
}

Assistant:

HighsStatus Highs::getCols(const HighsInt num_set_entries, const HighsInt* set,
                           HighsInt& num_col, double* costs, double* lower,
                           double* upper, HighsInt& num_nz, HighsInt* start,
                           HighsInt* index, double* value) const {
  if (num_set_entries == 0) {
    // Empty interval
    num_col = 0;
    num_nz = 0;
    return HighsStatus::kOk;
  }
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, num_set_entries, set, model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "getCols", create_error,
                                 false, num_set_entries, set,
                                 model_.lp_.num_col_);
  getColsInterface(index_collection, num_col, costs, lower, upper, num_nz,
                   start, index, value);
  return HighsStatus::kOk;
}